

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

int lua_rawgetp(lua_State *L,int idx,void *p)

{
  lu_byte tag;
  int iVar1;
  TValue *io;
  TValue k;
  Table *t;
  void *p_local;
  int idx_local;
  lua_State *L_local;
  
  k._8_8_ = gettable(L,idx);
  k.value_.ub = '\x02';
  io = (TValue *)p;
  tag = luaH_get((Table *)k._8_8_,(TValue *)&io,&((L->top).p)->val);
  iVar1 = finishrawget(L,tag);
  return iVar1;
}

Assistant:

LUA_API int lua_rawgetp (lua_State *L, int idx, const void *p) {
  Table *t;
  TValue k;
  lua_lock(L);
  t = gettable(L, idx);
  setpvalue(&k, cast_voidp(p));
  return finishrawget(L, luaH_get(t, &k, s2v(L->top.p)));
}